

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void scale_component(opj_image_comp_t *component,OPJ_UINT32 precision)

{
  OPJ_INT32 *pOVar1;
  ulong uVar2;
  byte bVar3;
  OPJ_UINT32 *l_data_1;
  OPJ_INT32 *l_data;
  OPJ_SIZE_T len;
  OPJ_SIZE_T i;
  int shift;
  OPJ_UINT32 precision_local;
  opj_image_comp_t *component_local;
  
  if (component->prec != precision) {
    if (component->prec < precision) {
      scale_component_up(component,precision);
    }
    else {
      bVar3 = (char)component->prec - (char)precision;
      uVar2 = (ulong)component->w * (ulong)component->h;
      if (component->sgnd == 0) {
        pOVar1 = component->data;
        for (len = 0; len < uVar2; len = len + 1) {
          pOVar1[len] = (uint)pOVar1[len] >> (bVar3 & 0x1f);
        }
      }
      else {
        pOVar1 = component->data;
        for (len = 0; len < uVar2; len = len + 1) {
          pOVar1[len] = pOVar1[len] >> (bVar3 & 0x1f);
        }
      }
      component->bpp = precision;
      component->prec = precision;
    }
  }
  return;
}

Assistant:

void scale_component(opj_image_comp_t* component, OPJ_UINT32 precision)
{
	int shift;
	OPJ_SIZE_T i, len;
	
	if (component->prec == precision) {
		return;
	}
	if (component->prec < precision) {
		scale_component_up(component, precision);
		return;
	}
	shift = (int)(component->prec - precision);
	len = (OPJ_SIZE_T)component->w * (OPJ_SIZE_T)component->h;
	if (component->sgnd) {
		OPJ_INT32* l_data = component->data;
		for (i = 0; i < len; ++i) {
			l_data[i] >>= shift;
		}
	} else {
		OPJ_UINT32* l_data = (OPJ_UINT32*)component->data;
		for (i = 0; i < len; ++i) {
			l_data[i] >>= shift;
		}
	}
	component->bpp = precision;
	component->prec = precision;
}